

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall
despot::option::PrintUsageImplementation::LineWrapper::output
          (LineWrapper *this,IStringWriter *write,char *data,int len)

{
  bool bVar1;
  int len_local;
  char *data_local;
  IStringWriter *write_local;
  LineWrapper *this_local;
  
  bVar1 = buf_full(this);
  if (bVar1) {
    write_one_line(this,write);
  }
  buf_store(this,data,len);
  return;
}

Assistant:

void output(IStringWriter& write, const char* data, int len) {
			if (buf_full())
				write_one_line(write);

			buf_store(data, len);
		}